

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cmd.h
# Opt level: O1

void __thiscall Cmd::cmdLoop(Cmd *this)

{
  bool bVar1;
  bool bVar2;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> line;
  undefined1 local_58 [32];
  bool local_38;
  
  bVar2 = false;
  do {
    if (bVar2 != false) {
      return;
    }
    nextLine_abi_cxx11_((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)local_58,this,false);
    bVar1 = local_38;
    if (local_38 == true) {
      bVar2 = oneCmd(this,(string *)local_58);
    }
    if ((local_38 == true) && (local_38 = false, (undefined1 *)local_58._0_8_ != local_58 + 0x10)) {
      operator_delete((void *)local_58._0_8_,local_58._16_8_ + 1);
    }
  } while (bVar1 != false);
  return;
}

Assistant:

void cmdLoop() {
		bool stop = false;
		while (!stop) {
			std::optional<std::string> line = nextLine();
			if (!line) {
				break;
			}
			stop = oneCmd(*line);
		}
	}